

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhosttx.cpp
# Opt level: O3

int __thiscall CVmHostIfcText::add_resfile(CVmHostIfcText *this,char *fname)

{
  size_t sVar1;
  char **ppcVar2;
  char *pcVar3;
  
  sVar1 = this->ext_cnt_;
  if (sVar1 == this->ext_max_) {
    this->ext_max_ = sVar1 + 10;
    ppcVar2 = (char **)realloc(this->ext_,sVar1 * 8 + 0x50);
    this->ext_ = ppcVar2;
  }
  pcVar3 = lib_copy_str(fname);
  sVar1 = this->ext_cnt_;
  this->ext_cnt_ = sVar1 + 1;
  this->ext_[sVar1] = pcVar3;
  return (int)this->ext_cnt_ + -1;
}

Assistant:

int CVmHostIfcText::add_resfile(const char *fname)
{
    /* expand the resource file list if necessary */
    if (ext_cnt_ == ext_max_)
    {
        /* bump up the maximum a bit */
        ext_max_ += 10;

        /* reallocate the entry pointer array */
        ext_ = (char **)t3realloc(ext_, ext_max_ * sizeof(ext_[0]));
    }

    /* store the new entry */
    ext_[ext_cnt_++] = lib_copy_str(fname);

    /* 
     *   return the new entry's file number (we've already bumped the index,
     *   so it's the current count minus one) 
     */
    return ext_cnt_ - 1;
}